

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

bool anon_unknown.dwarf_10919a6::TestPresetOptionalFilterIncludeIndexHelper
               (optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *out,
               Value *value,cmJSONState *state)

{
  bool bVar1;
  String SStack_38;
  
  if (value == (Value *)0x0) {
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
    _M_reset((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
              *)out);
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      bVar1 = Json::Value::isObject(value);
      if (!bVar1) {
        return false;
      }
      bVar1 = std::
              function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
              ::operator()((function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
                            *)(anonymous_namespace)::
                              TestPresetOptionalFilterIncludeIndexObjectHelper,out,value,state);
      return bVar1;
    }
    std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::emplace<>(out);
    Json::Value::asString_abi_cxx11_(&SStack_38,value);
    std::__cxx11::string::operator=
              ((string *)
               &(out->
                super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
                )._M_payload.
                super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
                .
                super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                ._M_payload._M_value.IndexFile,(string *)&SStack_38);
    std::__cxx11::string::~string((string *)&SStack_38);
  }
  return true;
}

Assistant:

bool TestPresetOptionalFilterIncludeIndexHelper(
  cm::optional<TestPreset::IncludeOptions::IndexOptions>& out,
  const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (value->isString()) {
    out.emplace();
    out->IndexFile = value->asString();
    return true;
  }

  if (value->isObject()) {
    return TestPresetOptionalFilterIncludeIndexObjectHelper(out, value, state);
  }

  return false;
}